

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

void __thiscall
lossless_neural_sound::expression_compiler::expression::Element_variable::write_indexes
          (Element_variable *this,ostream *os)

{
  ostream *poVar1;
  size_t i;
  long lVar2;
  long lVar3;
  char *pcVar4;
  
  lVar3 = 0;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    lVar3 = lVar3 + (ulong)((this->matrix_variable->sizes)._M_elems[lVar2] != 1);
  }
  if (lVar3 == 1) {
    poVar1 = std::operator<<(os,"[");
    os = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    pcVar4 = "]";
  }
  else {
    std::operator<<(os,"(");
    pcVar4 = "";
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 8) {
      poVar1 = std::operator<<(os,pcVar4);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      pcVar4 = ", ";
    }
    pcVar4 = ")";
  }
  std::operator<<(os,pcVar4);
  return;
}

Assistant:

void write_indexes(std::ostream &os) const
    {
        std::size_t non_unit_dimension_count = 0;
        std::size_t non_unit_dimension_index = 0;
        for(std::size_t i = 0; i < indexes.size(); i++)
        {
            if(matrix_variable->sizes[i] != 1)
            {
                non_unit_dimension_count++;
                non_unit_dimension_index = i;
            }
        }
        if(non_unit_dimension_count == 1)
        {
            os << "[" << indexes[indexes.size() - 1 - non_unit_dimension_index] << "]";
        }
        else
        {
            auto separator = "";
            os << "(";
            for(std::size_t i : indexes)
            {
                os << separator << i;
                separator = ", ";
            }
            os << ")";
        }
    }